

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

void __thiscall irr::io::SNamedPath::SNamedPath(SNamedPath *this,path *p)

{
  core::string<char>::string(&this->Path,p);
  PathToName(&this->InternalName,this,p);
  return;
}

Assistant:

SNamedPath(const path &p) :
			Path(p), InternalName(PathToName(p))
	{
	}